

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O3

void __thiscall wasm::LocalAnalyzer::analyze(LocalAnalyzer *this,Function *func)

{
  ulong *puVar1;
  uint uVar2;
  pointer puVar3;
  _Bit_type *p_Var4;
  ulong *puVar5;
  byte bVar6;
  size_t __new_size;
  size_t sVar7;
  difference_type __n;
  size_t sVar8;
  ulong uVar9;
  ulong *__s;
  
  __new_size = Function::getNumLocals(func);
  puVar3 = (this->numSets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->numSets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->numSets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->numSets,__new_size);
  puVar3 = (this->numGets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->numGets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->numGets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->numGets,__new_size);
  (this->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p =
       (this->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  (this->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  std::vector<bool,_std::allocator<bool>_>::resize(&this->sfa,__new_size,false);
  p_Var4 = (this->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  sVar7 = Function::getNumParams(func);
  sVar8 = sVar7 + 0x3f;
  if (-1 < (long)sVar7) {
    sVar8 = sVar7;
  }
  puVar1 = p_Var4 + ((long)sVar8 >> 6) + (ulong)((sVar7 & 0x800000000000003f) < 0x8000000000000001);
  __s = puVar1 + -1;
  puVar5 = (this->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar2 = (this->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  bVar6 = (byte)sVar7;
  if (__s == puVar5) {
    if (((uint)sVar7 & 0x3f) == uVar2) goto LAB_007f0a25;
    uVar9 = ((0xffffffffffffffffU >> (-(char)uVar2 & 0x3fU)) >> (bVar6 & 0x3f)) << (bVar6 & 0x3f);
  }
  else {
    if ((sVar7 & 0x3f) != 0) {
      *__s = *__s | -1L << (bVar6 & 0x3f);
      __s = puVar1;
    }
    memset(__s,0xff,(long)puVar5 - (long)__s);
    if (uVar2 == 0) goto LAB_007f0a25;
    uVar9 = 0xffffffffffffffff >> (-(char)uVar2 & 0x3fU);
    __s = puVar5;
  }
  *__s = *__s | uVar9;
LAB_007f0a25:
  Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>::walk
            ((Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_> *)this,
             &func->body);
  if (__new_size != 0) {
    puVar3 = (this->numSets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    p_Var4 = (this->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p;
    uVar9 = 0;
    do {
      if (puVar3[uVar9] == 0) {
        bVar6 = (byte)uVar9 & 0x3f;
        puVar1 = p_Var4 + (uVar9 >> 6 & 0x3ffffff);
        *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      }
      uVar9 = uVar9 + 1;
    } while ((uVar9 & 0xffffffff) < __new_size);
  }
  return;
}

Assistant:

void analyze(Function* func) {
    auto num = func->getNumLocals();
    numSets.clear();
    numSets.resize(num);
    numGets.clear();
    numGets.resize(num);
    sfa.clear();
    sfa.resize(num);
    std::fill(sfa.begin() + func->getNumParams(), sfa.end(), true);
    walk(func->body);
    for (Index i = 0; i < num; i++) {
      if (numSets[i] == 0) {
        sfa[i] = false;
      }
    }
  }